

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::dragLeaveEvent(QGraphicsView *this,QDragLeaveEvent *event)

{
  long lVar1;
  bool bVar2;
  MouseButtons buttons;
  KeyboardModifiers modifiers;
  DropActions actions;
  DropAction DVar3;
  QMimeData *data;
  QWidget *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QPointF QVar6;
  QPointF local_58;
  QGraphicsSceneEvent local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
  if ((bVar2) && ((*(byte *)(lVar1 + 0x300) & 1) != 0)) {
    if (*(long *)(lVar1 + 0x520) == 0) {
      local_48.super_QEvent = (QEvent)0x2;
      local_48._1_3_ = 0;
      local_48.d_ptr.d._4_4_ = 0;
      local_48._4_4_ = 0;
      local_48._8_4_ = 0;
      local_48._12_4_ = 0;
      local_48.d_ptr.d._0_4_ = 0;
      local_30 = "default";
      QMessageLogger::warning
                ((char *)&local_48,
                 "QGraphicsView::dragLeaveEvent: drag leave received before drag enter");
    }
    else {
      local_48.d_ptr.d._0_4_ = 0xaaaaaaaa;
      local_48.d_ptr.d._4_4_ = 0xaaaaaaaa;
      local_48.super_QEvent = (QEvent)0xaa;
      local_48._1_3_ = 0xaaaaaa;
      local_48._4_4_ = 0xaaaaaaaa;
      local_48._8_4_ = 0xaaaaaaaa;
      local_48._12_4_ = 0xaaaaaaaa;
      QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                ((QGraphicsSceneDragDropEvent *)&local_48,GraphicsSceneDragLeave);
      QVar6 = QGraphicsSceneDragDropEvent::scenePos
                        (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      local_58.yp = QVar6.yp;
      local_58.xp = QVar6.xp;
      QGraphicsSceneDragDropEvent::setScenePos((QGraphicsSceneDragDropEvent *)&local_48,&local_58);
      local_58.xp = (qreal)QGraphicsSceneDragDropEvent::screenPos
                                     (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setScreenPos
                ((QGraphicsSceneDragDropEvent *)&local_48,(QPoint *)&local_58);
      buttons = QGraphicsSceneDragDropEvent::buttons
                          (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setButtons((QGraphicsSceneDragDropEvent *)&local_48,buttons);
      modifiers = QGraphicsSceneDragDropEvent::modifiers
                            (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setModifiers((QGraphicsSceneDragDropEvent *)&local_48,modifiers);
      actions = QGraphicsSceneDragDropEvent::possibleActions
                          (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setPossibleActions
                ((QGraphicsSceneDragDropEvent *)&local_48,actions);
      DVar3 = QGraphicsSceneDragDropEvent::proposedAction
                        (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setProposedAction((QGraphicsSceneDragDropEvent *)&local_48,DVar3)
      ;
      DVar3 = QGraphicsSceneDragDropEvent::dropAction
                        (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setDropAction((QGraphicsSceneDragDropEvent *)&local_48,DVar3);
      data = QGraphicsSceneDragDropEvent::mimeData(*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520))
      ;
      QGraphicsSceneDragDropEvent::setMimeData((QGraphicsSceneDragDropEvent *)&local_48,data);
      pQVar4 = QGraphicsSceneEvent::widget(*(QGraphicsSceneEvent **)(lVar1 + 0x520));
      QGraphicsSceneEvent::setWidget(&local_48,pQVar4);
      pQVar4 = QGraphicsSceneDragDropEvent::source(*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520))
      ;
      QGraphicsSceneDragDropEvent::setSource((QGraphicsSceneDragDropEvent *)&local_48,pQVar4);
      if (*(long **)(lVar1 + 0x520) != (long *)0x0) {
        (**(code **)(**(long **)(lVar1 + 0x520) + 8))();
      }
      *(undefined8 *)(lVar1 + 0x520) = 0;
      if ((*(long *)(lVar1 + 0x490) == 0) || (*(int *)(*(long *)(lVar1 + 0x490) + 4) == 0)) {
        pQVar5 = (QObject *)0x0;
      }
      else {
        pQVar5 = *(QObject **)(lVar1 + 0x498);
      }
      QCoreApplication::sendEvent(pQVar5,&local_48.super_QEvent);
      if (local_48._12_1_ == '\x01') {
        (**(code **)(*(long *)event + 0x10))(event,1);
      }
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::dragLeaveEvent(QDragLeaveEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;
    if (!d->lastDragDropEvent) {
        qWarning("QGraphicsView::dragLeaveEvent: drag leave received before drag enter");
        return;
    }

    // Generate a scene event.
    QGraphicsSceneDragDropEvent sceneEvent(QEvent::GraphicsSceneDragLeave);
    sceneEvent.setScenePos(d->lastDragDropEvent->scenePos());
    sceneEvent.setScreenPos(d->lastDragDropEvent->screenPos());
    sceneEvent.setButtons(d->lastDragDropEvent->buttons());
    sceneEvent.setModifiers(d->lastDragDropEvent->modifiers());
    sceneEvent.setPossibleActions(d->lastDragDropEvent->possibleActions());
    sceneEvent.setProposedAction(d->lastDragDropEvent->proposedAction());
    sceneEvent.setDropAction(d->lastDragDropEvent->dropAction());
    sceneEvent.setMimeData(d->lastDragDropEvent->mimeData());
    sceneEvent.setWidget(d->lastDragDropEvent->widget());
    sceneEvent.setSource(d->lastDragDropEvent->source());
    delete d->lastDragDropEvent;
    d->lastDragDropEvent = nullptr;

    // Send it to the scene.
    QCoreApplication::sendEvent(d->scene, &sceneEvent);

    // Accept the originating event if the scene accepted the scene event.
    if (sceneEvent.isAccepted())
        event->setAccepted(true);
}